

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O0

int GenlibClientSubscription_assign(GenlibClientSubscription *p,GenlibClientSubscription *q)

{
  int iVar1;
  UpnpString *pUVar2;
  GenlibClientSubscription *n;
  bool bVar3;
  bool bVar4;
  undefined1 local_59;
  undefined4 local_1c;
  int ok;
  GenlibClientSubscription *q_local;
  GenlibClientSubscription *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = GenlibClientSubscription_get_RenewEventId(q);
    iVar1 = GenlibClientSubscription_set_RenewEventId(p,iVar1);
    bVar3 = false;
    if (iVar1 != 0) {
      pUVar2 = GenlibClientSubscription_get_SID(q);
      iVar1 = GenlibClientSubscription_set_SID(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = GenlibClientSubscription_get_ActualSID(q);
      iVar1 = GenlibClientSubscription_set_ActualSID(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = GenlibClientSubscription_get_EventURL(q);
      iVar1 = GenlibClientSubscription_set_EventURL(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    local_59 = false;
    if (bVar3) {
      n = GenlibClientSubscription_get_Next(q);
      iVar1 = GenlibClientSubscription_set_Next(p,n);
      local_59 = iVar1 != 0;
    }
    local_1c = (uint)local_59;
  }
  return local_1c;
}

Assistant:

int GenlibClientSubscription_assign(
	GenlibClientSubscription *p, const GenlibClientSubscription *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     GenlibClientSubscription_set_RenewEventId(
			     p, GenlibClientSubscription_get_RenewEventId(q));
		ok = ok && GenlibClientSubscription_set_SID(
				   p, GenlibClientSubscription_get_SID(q));
		ok = ok && GenlibClientSubscription_set_ActualSID(p,
				   GenlibClientSubscription_get_ActualSID(q));
		ok = ok && GenlibClientSubscription_set_EventURL(
				   p, GenlibClientSubscription_get_EventURL(q));
		ok = ok && GenlibClientSubscription_set_Next(
				   p, GenlibClientSubscription_get_Next(q));
	}

	return ok;
}